

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecoderDecodeFull
          (ZydisDecoder *decoder,void *buffer,ZyanUSize length,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count,ZydisDecodingFlags flags)

{
  byte bVar1;
  undefined1 local_60 [2];
  ZyanU8 count;
  ZyanBool visible_only;
  ZyanStatus status_047620348;
  ZydisDecoderContext context;
  ZyanU8 operand_count_local;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *instruction_local;
  ZyanUSize length_local;
  void *buffer_local;
  ZydisDecoder *decoder_local;
  
  if (((((decoder == (ZydisDecoder *)0x0) || (buffer == (void *)0x0)) || (length == 0)) ||
      ((instruction == (ZydisDecodedInstruction *)0x0 ||
       ((operand_count != '\0' && (operands == (ZydisDecodedOperand *)0x0)))))) ||
     (10 < operand_count)) {
    decoder_local._4_4_ = 0x80100004;
  }
  else if (decoder->decoder_mode[0] == '\0') {
    context._31_1_ = operand_count;
    decoder_local._4_4_ =
         ZydisDecoderDecodeInstruction
                   (decoder,(ZydisDecoderContext *)local_60,buffer,length,instruction);
    if ((decoder_local._4_4_ & 0x80000000) == 0) {
      if ((flags & 1) == 0) {
        bVar1 = instruction->operand_count;
      }
      else {
        bVar1 = instruction->operand_count_visible;
      }
      if ((byte)context._31_1_ < bVar1) {
        bVar1 = context._31_1_;
      }
      context._31_1_ = bVar1;
      if (context._31_1_ == 0) {
        decoder_local._4_4_ = 0x100000;
      }
      else {
        decoder_local._4_4_ =
             ZydisDecoderDecodeOperands
                       (decoder,(ZydisDecoderContext *)local_60,instruction,operands,context._31_1_)
        ;
      }
    }
  }
  else {
    decoder_local._4_4_ = 0x8010000d;
  }
  return decoder_local._4_4_;
}

Assistant:

ZyanStatus ZydisDecoderDecodeFull(const ZydisDecoder* decoder,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand* operands, ZyanU8 operand_count, ZydisDecodingFlags flags)
{
    if (!decoder || !buffer || !length || !instruction || (operand_count && !operands) ||
        (operand_count > ZYDIS_MAX_OPERAND_COUNT))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (decoder->decoder_mode[ZYDIS_DECODER_MODE_MINIMAL])
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    ZydisDecoderContext context;
    ZYAN_CHECK(ZydisDecoderDecodeInstruction(decoder, &context, buffer, length, instruction));

    const ZyanBool visible_only = flags & ZYDIS_DFLAG_VISIBLE_OPERANDS_ONLY;
    const ZyanU8 count = visible_only
        ? instruction->operand_count_visible
        : instruction->operand_count;

    operand_count = ZYAN_MIN(operand_count, count);
    if (!operand_count)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    return ZydisDecoderDecodeOperands(decoder, &context, instruction, operands, operand_count);
}